

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

void __thiscall
spvtools::opt::Function::ForEachInst
          (Function *this,function<void_(spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts,bool run_on_non_semantic_insts)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/function.cpp:60:7)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/function.cpp:60:7)>
             ::_M_manager;
  local_28._M_unused._M_object = f;
  WhileEachInst(this,(function<bool_(spvtools::opt::Instruction_*)> *)&local_28,
                run_on_debug_line_insts,run_on_non_semantic_insts);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void Function::ForEachInst(const std::function<void(Instruction*)>& f,
                           bool run_on_debug_line_insts,
                           bool run_on_non_semantic_insts) {
  WhileEachInst(
      [&f](Instruction* inst) {
        f(inst);
        return true;
      },
      run_on_debug_line_insts, run_on_non_semantic_insts);
}